

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O1

void __thiscall Knn::getData(Knn *this,string *filename)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  vector<double,_std::allocator<double>_> temData;
  double onepoint;
  string line;
  ifstream infile;
  stringstream stringin;
  value_type local_408;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_3f0;
  double local_3e8;
  undefined1 *local_3e0;
  long local_3d8;
  undefined1 local_3d0 [16];
  long local_3c0 [4];
  byte abStack_3a0 [488];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_3e0 = local_3d0;
  local_3d8 = 0;
  local_3d0[0] = 0;
  local_3f0 = &(this->super_Base).inData;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(local_3f0);
  std::ifstream::ifstream((istream *)local_3c0,(string *)filename,_S_in);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ...",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 2) == 0) {
    do {
      if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) +
                              (char)(istream *)local_3c0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3c0,(string *)&local_3e0,cVar1);
      if (local_3d8 != 0) {
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_3e0,_S_out|_S_in);
        while( true ) {
          piVar2 = std::istream::_M_extract<double>((double *)local_1b8);
          if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
          if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_408,
                       (iterator)
                       local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_3e8);
          }
          else {
            *local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = local_3e8;
            local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        (this->super_Base).indim =
             ((long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) - 1;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(local_3f0,&local_408);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
      }
    } while ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 2) == 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"total data is ",0xe);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ifstream::~ifstream(local_3c0);
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Knn::getData(const std::string &filename) {
    //load data to a vector
    std::vector<double> temData;
    double onepoint;
    std::string line;
    inData.clear();
    std::ifstream infile(filename);
    std::cout<<"reading ..."<<std::endl;
    while(!infile.eof()){
        temData.clear();
        std::getline(infile, line);
        if(line.empty())
            continue;
        std::stringstream stringin(line);
        while(stringin >> onepoint){
            temData.push_back(onepoint);
        }
        indim = temData.size();
        indim -= 1;
        inData.push_back(temData);
    }
    std::cout<<"total data is "<<inData.size()<<std::endl;
}